

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu2.c
# Opt level: O0

MPP_RET hal_vp8d_vdpu2_start(void *hal,HalTaskInfo *task)

{
  undefined8 uVar1;
  undefined1 auStack_50 [4];
  RK_U32 reg_size;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  VP8DRegSet_t *regs;
  VP8DHalContext_t *ctx;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  uVar1 = *(undefined8 *)((long)hal + 0x18);
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x286,
               "hal_vp8d_vdpu2_start");
  }
  if ((hal_vp8d_debug & 4) != 0) {
    hal_vp8d_vdpu2_dump_info(hal,task);
  }
  rd_cfg._8_8_ = uVar1;
  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    rd_cfg.reg._0_4_ = 0x27c;
    rd_cfg.reg._4_4_ = 0;
    _auStack_50 = uVar1;
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),5,auStack_50);
    if (ctx._4_4_ == MPP_OK) {
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0xf,(void *)0x0);
      if (ctx._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_vp8d_vdpu2","send cmd failed %d\n","hal_vp8d_vdpu2_start",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_vp8d_vdpu2","set register read failed %d\n","hal_vp8d_vdpu2_start",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_vp8d_vdpu2","set register write failed %d\n","hal_vp8d_vdpu2_start",
               (ulong)(uint)ctx._4_4_);
  }
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x2aa,
               "hal_vp8d_vdpu2_start");
  }
  return ctx._4_4_;
}

Assistant:

MPP_RET hal_vp8d_vdpu2_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;
    VP8DRegSet_t *regs = (VP8DRegSet_t *)ctx->regs;

    FUN_T("FUN_IN");
    if (hal_vp8d_debug & VP8H_DBG_DUMP_REG)
        hal_vp8d_vdpu2_dump_info(hal, task);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = sizeof(VP8DRegSet_t);

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    FUN_T("FUN_OUT");

    (void)task;
    return ret;
}